

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths.cpp
# Opt level: O2

QStringList *
QStandardPaths::locateAll
          (QStringList *__return_storage_ptr__,StandardLocation type,QString *fileName,
          LocateOptions options)

{
  bool bVar1;
  QString *pQVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<QString> local_68;
  QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  standardLocations((QStringList *)&local_68,type);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  for (pQVar2 = local_68.ptr; pQVar2 != local_68.ptr + local_68.size; pQVar2 = pQVar2 + 1) {
    local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_50.a.b = L'/';
    local_50.a.a = pQVar2;
    local_50.b = fileName;
    QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>::convertTo<QString>
              ((QString *)&local_88,&local_50);
    bVar1 = existsAsSpecified((QString *)&local_88,options);
    if (bVar1) {
      QList<QString>::emplaceBack<QString_const&>(__return_storage_ptr__,(QString *)&local_88);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QStandardPaths::locateAll(StandardLocation type, const QString &fileName, LocateOptions options)
{
    const QStringList &dirs = standardLocations(type);
    QStringList result;
    for (QStringList::const_iterator dir = dirs.constBegin(); dir != dirs.constEnd(); ++dir) {
        const QString path = *dir + u'/' + fileName;
        if (existsAsSpecified(path, options))
            result.append(path);
    }
    return result;
}